

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::UpdateDebuggerPropertyInitializationOffset
          (ByteCodeGenerator *this,RegSlot location,PropertyId propertyId,bool shouldConsumeRegister
          )

{
  code *pcVar1;
  bool bVar2;
  ByteCodeWriter *pBVar3;
  undefined4 *puVar4;
  DebuggerScope *currentDebuggerScope_00;
  DebuggerScope *currentDebuggerScope;
  bool shouldConsumeRegister_local;
  PropertyId propertyId_local;
  RegSlot location_local;
  ByteCodeGenerator *this_local;
  
  pBVar3 = Writer(this);
  if (pBVar3 == (ByteCodeWriter *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1d5,"(this->Writer())","this->Writer()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pBVar3 = Writer(this);
  currentDebuggerScope_00 = Js::ByteCodeWriter::GetCurrentDebuggerScope(pBVar3);
  if (currentDebuggerScope_00 == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1d7,"(currentDebuggerScope)","currentDebuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (currentDebuggerScope_00 != (DebuggerScope *)0x0) {
    pBVar3 = Writer(this);
    Js::ByteCodeWriter::UpdateDebuggerPropertyInitializationOffset
              (pBVar3,currentDebuggerScope_00,location,propertyId,shouldConsumeRegister,-1,false);
  }
  return;
}

Assistant:

void ByteCodeGenerator::UpdateDebuggerPropertyInitializationOffset(Js::RegSlot location, Js::PropertyId propertyId, bool shouldConsumeRegister)
{
    Assert(this->Writer());
    Js::DebuggerScope* currentDebuggerScope = this->Writer()->GetCurrentDebuggerScope();
    Assert(currentDebuggerScope);
    if (currentDebuggerScope != nullptr)
    {
        this->Writer()->UpdateDebuggerPropertyInitializationOffset(
            currentDebuggerScope,
            location,
            propertyId,
            shouldConsumeRegister);
    }
}